

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

void mqtt_mq_clean(mqtt_message_queue *mq)

{
  int *piVar1;
  long lVar2;
  void *pvVar3;
  size_t __n;
  long lVar4;
  long *plVar5;
  size_t local_48;
  size_t local_40;
  long local_38;
  ssize_t i;
  ssize_t new_tail_idx;
  size_t removing;
  size_t n;
  mqtt_queued_message *new_head;
  mqtt_message_queue *mq_local;
  
  pvVar3 = mq->mem_end;
  do {
    n = (long)pvVar3 - 0x28;
    if (n < mq->queue_tail) break;
    piVar1 = (int *)((long)pvVar3 + -0x18);
    pvVar3 = (void *)n;
  } while (*piVar1 == 2);
  if (n < mq->queue_tail) {
    mq->curr = (uint8_t *)mq->mem_start;
    mq->queue_tail = (mqtt_queued_message *)mq->mem_end;
    if ((mqtt_queued_message *)mq->curr < mq->queue_tail + -1) {
      local_40 = (long)mq->queue_tail + (-0x28 - (long)mq->curr);
    }
    else {
      local_40 = 0;
    }
    mq->curr_sz = local_40;
  }
  else if (n != (long)mq->mem_end - 0x28U) {
    __n = (long)mq->curr - *(long *)n;
    lVar2 = *(long *)n;
    pvVar3 = mq->mem_start;
    memmove(mq->mem_start,*(void **)n,__n);
    mq->curr = (uint8_t *)((long)mq->mem_start + __n);
    lVar4 = (long)(n - (long)mq->queue_tail) / 0x28;
    memmove((void *)((long)mq->mem_end + lVar4 * -0x28 + -0x28),mq->queue_tail,(lVar4 + 1) * 0x28);
    mq->queue_tail = (mqtt_queued_message *)((long)mq->mem_end + lVar4 * -0x28 + -0x28);
    for (local_38 = 0; local_38 < lVar4 + 1; local_38 = local_38 + 1) {
      plVar5 = (long *)((long)mq->mem_end + local_38 * -0x28 + -0x28);
      *plVar5 = *plVar5 - (lVar2 - (long)pvVar3);
    }
    if ((mqtt_queued_message *)mq->curr < mq->queue_tail + -1) {
      local_48 = (long)mq->queue_tail + (-0x28 - (long)mq->curr);
    }
    else {
      local_48 = 0;
    }
    mq->curr_sz = local_48;
  }
  return;
}

Assistant:

void mqtt_mq_clean(struct mqtt_message_queue *mq) {
    struct mqtt_queued_message *new_head;

    for(new_head = mqtt_mq_get(mq, 0); new_head >= mq->queue_tail; --new_head) {
        if (new_head->state != MQTT_QUEUED_COMPLETE) break;
    }
    
    /* check if everything can be removed */
    if (new_head < mq->queue_tail) {
        mq->curr = (uint8_t *)mq->mem_start;
        mq->queue_tail = (struct mqtt_queued_message *)mq->mem_end;
        mq->curr_sz = (size_t) (mqtt_mq_currsz(mq));
        return;
    } else if (new_head == mqtt_mq_get(mq, 0)) {
        /* do nothing */
        return;
    }

    /* move buffered data */
    {
        size_t n = (size_t) (mq->curr - new_head->start);
        size_t removing = (size_t) (new_head->start - (uint8_t*) mq->mem_start);
        memmove(mq->mem_start, new_head->start, n);
        mq->curr = (unsigned char*)mq->mem_start + n;
      

        /* move queue */
        {
            ssize_t new_tail_idx = new_head - mq->queue_tail;
            memmove(mqtt_mq_get(mq, new_tail_idx), mq->queue_tail, sizeof(struct mqtt_queued_message) * (size_t) ((new_tail_idx + 1)));
            mq->queue_tail = mqtt_mq_get(mq, new_tail_idx);
          
            {
                /* bump back start's */
                ssize_t i = 0;
                for(; i < new_tail_idx + 1; ++i) {
                    mqtt_mq_get(mq, i)->start -= removing;
                }
            }
        }
    }

    /* get curr_sz */
    mq->curr_sz = (size_t) (mqtt_mq_currsz(mq));
}